

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseNode
          (DOMRangeImpl *this,DOMNode *n,bool isFullySelected,bool isLeft,int how)

{
  uint uVar1;
  int iVar2;
  DOMNode *pDVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,isFullySelected) != 0) {
    pDVar3 = traverseFullySelected(this,n,how);
    return pDVar3;
  }
  uVar1 = (*n->_vptr_DOMNode[4])(n);
  if (((ushort)uVar1 < 9) && ((0x198U >> (uVar1 & 0x1f) & 1) != 0)) {
    pDVar3 = traverseTextNode(this,n,isLeft,how);
    return pDVar3;
  }
  if (how - 1U < 2) {
    iVar2 = (*n->_vptr_DOMNode[0xd])(n,0);
    return (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode* DOMRangeImpl::traverseNode( DOMNode* n, bool isFullySelected, bool isLeft, int how )
{
    if ( isFullySelected )
        return traverseFullySelected( n, how );

    short type = n->getNodeType();

    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
        return traverseTextNode( n, isLeft, how );

    return traversePartiallySelected( n, how );
}